

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mockaron.cpp
# Opt level: O2

void mockaron::detail::register_function_mock(void *n,any *h)

{
  size_type sVar1;
  mapped_type *this;
  void *n_local;
  
  n_local = n;
  sVar1 = std::
          _Hashtable<const_void_*,_std::pair<const_void_*const,_mockaron::detail::any>,_std::allocator<std::pair<const_void_*const,_mockaron::detail::any>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count((_Hashtable<const_void_*,_std::pair<const_void_*const,_mockaron::detail::any>,_std::allocator<std::pair<const_void_*const,_mockaron::detail::any>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(anonymous_namespace)::function_mocks,&n_local);
  if (sVar1 == 0) {
    this = std::__detail::
           _Map_base<const_void_*,_std::pair<const_void_*const,_mockaron::detail::any>,_std::allocator<std::pair<const_void_*const,_mockaron::detail::any>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_void_*,_std::pair<const_void_*const,_mockaron::detail::any>,_std::allocator<std::pair<const_void_*const,_mockaron::detail::any>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)(anonymous_namespace)::function_mocks,&n_local);
    any::operator=(this,h);
    return;
  }
  __assert_fail("!function_mocks.count(n)",
                "/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/src/mockaron.cpp"
                ,0x33,"void mockaron::detail::register_function_mock(const void *, any)");
}

Assistant:

void register_function_mock(void const* n, any h)
{
  assert(!function_mocks.count(n));
  function_mocks[n] = std::move(h);
}